

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speedcheck.c
# Opt level: O0

CURLcode Curl_speedcheck(Curl_easy *data,curltime now)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  timediff_t tVar4;
  curltime newer;
  curltime older;
  timediff_t howlong;
  Curl_easy *data_local;
  curltime now_local;
  
  if ((-1 < (data->progress).current_speed) && ((data->set).low_speed_time != 0)) {
    if ((data->progress).current_speed < (data->set).low_speed_limit) {
      if ((data->state).keeps_speed.tv_sec == 0) {
        (data->state).keeps_speed.tv_sec = now.tv_sec;
        *(ulong *)&(data->state).keeps_speed.tv_usec = CONCAT44(now_local.tv_sec._4_4_,now.tv_usec);
      }
      else {
        uVar2 = (data->state).keeps_speed.tv_sec;
        uVar3 = (data->state).keeps_speed.tv_usec;
        older.tv_usec = uVar3;
        older.tv_sec = uVar2;
        newer._12_4_ = 0;
        newer.tv_sec = SUB128(now._0_12_,0);
        newer.tv_usec = SUB124(now._0_12_,8);
        older._12_4_ = 0;
        tVar4 = Curl_timediff(newer,older);
        lVar1 = (data->set).low_speed_time;
        if (SBORROW8(tVar4,lVar1 * 1000) == tVar4 + lVar1 * -1000 < 0) {
          Curl_failf(data,
                     "Operation too slow. Less than %ld bytes/sec transferred the last %ld seconds",
                     (data->set).low_speed_limit,(data->set).low_speed_time);
          return CURLE_OPERATION_TIMEDOUT;
        }
      }
    }
    else {
      (data->state).keeps_speed.tv_sec = 0;
    }
  }
  if ((data->set).low_speed_limit != 0) {
    Curl_expire(data,1000,EXPIRE_SPEEDCHECK);
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_speedcheck(struct Curl_easy *data,
                         struct curltime now)
{
  if((data->progress.current_speed >= 0) && data->set.low_speed_time) {
    if(data->progress.current_speed < data->set.low_speed_limit) {
      if(!data->state.keeps_speed.tv_sec)
        /* under the limit at this very moment */
        data->state.keeps_speed = now;
      else {
        /* how long has it been under the limit */
        timediff_t howlong = Curl_timediff(now, data->state.keeps_speed);

        if(howlong >= data->set.low_speed_time * 1000) {
          /* too long */
          failf(data,
                "Operation too slow. "
                "Less than %ld bytes/sec transferred the last %ld seconds",
                data->set.low_speed_limit,
                data->set.low_speed_time);
          return CURLE_OPERATION_TIMEDOUT;
        }
      }
    }
    else
      /* faster right now */
      data->state.keeps_speed.tv_sec = 0;
  }

  if(data->set.low_speed_limit)
    /* if low speed limit is enabled, set the expire timer to make this
       connection's speed get checked again in a second */
    Curl_expire(data, 1000, EXPIRE_SPEEDCHECK);

  return CURLE_OK;
}